

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

int macro_getargtype(char *arg)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  t_symbol *ptVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  do {
    bVar7 = *arg;
    arg = (char *)((byte *)arg + 1);
  } while ((*(byte *)((long)puVar2 + (long)(char)bVar7 * 2 + 1) & 0x20) != 0);
  pp_Var5 = __ctype_toupper_loc();
  iVar3 = (*pp_Var5)[(char)bVar7];
  if (1 < iVar3 - 0x58U) {
    if (iVar3 == 0) {
      return 0;
    }
    if (iVar3 == 0x22) {
      return 5;
    }
    if (iVar3 == 0x23) {
      return 2;
    }
    if (iVar3 != 0x41) {
      if (iVar3 == 0x5b) {
        return 4;
      }
      bVar7 = *arg;
      goto LAB_0010d71a;
    }
  }
  bVar7 = *arg;
  if (bVar7 == 0) {
    return 1;
  }
LAB_0010d71a:
  uVar8 = (ulong)bVar7;
  lVar9 = 0;
  uVar10 = 0x40;
  iVar3 = 3;
  do {
    bVar7 = (byte)uVar8;
    if (lVar9 == 0x40) {
LAB_0010d76b:
      if ((uVar10 != 0) && (bVar7 == 0)) {
        strncpy(symbol + 1,arg,(ulong)uVar10);
        symbol[0] = (char)uVar10;
        symbol[(ulong)uVar10 + 1] = '\0';
        ptVar6 = stlook(0);
        iVar3 = 6;
        if ((ptVar6 != (t_symbol *)0x0) && (1 < ptVar6->type - 1U)) {
          iVar3 = (uint)(ptVar6->bank != 0xf0) * 3 + 3;
        }
      }
      return iVar3;
    }
    bVar7 = ((byte *)arg)[lVar9];
    uVar8 = (ulong)(char)bVar7;
    uVar1 = puVar2[uVar8];
    if ((lVar9 == 0) && ((uVar1 & 0x800) != 0)) {
      return 3;
    }
    if (((uVar1 & 8) == 0) &&
       ((0x31 < bVar7 - 0x2e || ((0x2000000040001U >> ((ulong)(bVar7 - 0x2e) & 0x3f) & 1) == 0)))) {
      uVar10 = (uint)lVar9;
      goto LAB_0010d76b;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int
macro_getargtype(char *arg)
{
	struct t_symbol *sym;
	char c;
	int  i;

	/* skip spaces */
	while (isspace(*arg))
		arg++;

	/* get type */
	switch (toupper(*arg++)) {
	case '\0':
		return (NO_ARG);

	case '"':
		return (ARG_STRING);

	case '#':
		return (ARG_IMM);

	case '[':
		return (ARG_INDIRECT);

	case 'A':
	case 'X':
	case 'Y':
		if (*arg == '\0')
			return (ARG_REG);

	default:
		/* symbol */
		c = arg[0];
		for(i = 0; i < SBOLSZ; i++) {
			c = arg[i];
			if (isdigit(c) && (i == 0))
				break;
			if ((!isalnum(c)) && (c != '_') && (c != '.') && (c != '@'))
				break;
		}

		if (i == 0)
			return (ARG_ABS);
		else {
			if (c != '\0')
				return (ARG_ABS);
			else {
				strncpy(&symbol[1], arg, i);
				symbol[0] = i;
				symbol[i+1] = '\0';

				if ((sym = stlook(0)) == NULL)
					return (ARG_LABEL);
				else {
					if((sym->type == UNDEF) || (sym->type == IFUNDEF))
						return (ARG_LABEL);
					if (sym->bank == RESERVED_BANK)
						return (ARG_ABS);
					else
						return (ARG_LABEL);
				}
			}
		}
	}
}